

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

double __thiscall
ImPlot::PlotHistogram<short>
          (ImPlot *this,char *label_id,short *values,int count,int bins,bool cumulative,bool density
          ,ImPlotRange range,bool outliers,double bar_scale)

{
  ImVector<double> *this_00;
  ImVector<double> *this_01;
  ImPlotContext *pIVar1;
  int i;
  int iVar2;
  double *pdVar3;
  int iVar4;
  char *pcVar5;
  int b;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int i_00;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_c0;
  double local_b8;
  int bins_local;
  short Max;
  char *local_70;
  double local_68;
  ImPlotRange range_local;
  short Min;
  undefined6 uStack_36;
  
  range_local.Max = range.Max;
  range_local.Min = range.Min;
  iVar6 = (int)values;
  if (count == 0 || iVar6 < 1) {
    return 0.0;
  }
  bins_local = count;
  if ((((range_local.Min == 0.0) && (!NAN(range_local.Min))) && (range_local.Max == 0.0)) &&
     (!NAN(range_local.Max))) {
    ImMinMaxArray<short>((short *)label_id,iVar6,&Min,&Max);
    range_local.Min = (double)(int)Min;
    range_local.Max = (double)(int)Max;
  }
  dVar12 = range_local.Max;
  local_70 = label_id;
  local_68 = range_local.Min;
  if (count < 0) {
    CalculateBins<short>((short *)label_id,iVar6,count,&range_local,&bins_local,(double *)&Min);
    local_b8 = (double)CONCAT62(uStack_36,Min);
    count = bins_local;
  }
  else {
    local_b8 = (range_local.Max - range_local.Min) / (double)count;
  }
  pIVar1 = GImPlot;
  this_00 = &GImPlot->Temp1;
  this_01 = &GImPlot->Temp2;
  ImVector<double>::resize(this_00,count);
  ImVector<double>::resize(this_01,count);
  iVar9 = 0;
  iVar8 = 0;
  if (0 < count) {
    iVar8 = count;
  }
  dVar13 = 0.0;
  for (; iVar8 != iVar9; iVar9 = iVar9 + 1) {
    dVar11 = dVar13 * local_b8 + local_68;
    pdVar3 = ImVector<double>::operator[](this_00,iVar9);
    *pdVar3 = dVar11 + local_b8 * 0.5;
    pdVar3 = ImVector<double>::operator[](this_01,iVar9);
    *pdVar3 = 0.0;
    dVar13 = dVar13 + 1.0;
  }
  i = count + -1;
  local_c0 = 0.0;
  iVar10 = 0;
  iVar9 = 0;
  pcVar5 = local_70;
  dVar13 = local_68;
  for (uVar7 = 0; ((ulong)values & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
    dVar11 = (double)(int)*(short *)(pcVar5 + uVar7 * 2);
    if ((dVar11 < dVar13) || (dVar12 < dVar11)) {
      if (dVar11 < dVar13) {
        iVar9 = iVar9 + 1;
      }
    }
    else {
      iVar4 = (int)((dVar11 - dVar13) / local_b8);
      iVar2 = iVar4;
      if (i <= iVar4) {
        iVar2 = i;
      }
      i_00 = 0;
      if (-1 < iVar4) {
        i_00 = iVar2;
      }
      pdVar3 = ImVector<double>::operator[](this_01,i_00);
      *pdVar3 = *pdVar3 + 1.0;
      pdVar3 = ImVector<double>::operator[](this_01,i_00);
      if (local_c0 < *pdVar3) {
        pdVar3 = ImVector<double>::operator[](this_01,i_00);
        local_c0 = *pdVar3;
      }
      iVar10 = iVar10 + 1;
      pcVar5 = local_70;
      dVar13 = local_68;
    }
  }
  if (((byte)bins & cumulative) == 0) {
    if ((byte)bins == 0) {
      if (cumulative) {
        if (density) {
          iVar10 = iVar6;
        }
        dVar12 = 1.0 / ((double)iVar10 * local_b8);
        for (iVar6 = 0; iVar8 != iVar6; iVar6 = iVar6 + 1) {
          pdVar3 = ImVector<double>::operator[](this_01,iVar6);
          *pdVar3 = *pdVar3 * dVar12;
        }
        local_c0 = local_c0 * dVar12;
      }
      goto LAB_001e3d52;
    }
    if (density) {
      pdVar3 = ImVector<double>::operator[](this_01,0);
      *pdVar3 = (double)iVar9 + *pdVar3;
    }
    for (iVar6 = 1; iVar6 < count; iVar6 = iVar6 + 1) {
      pdVar3 = ImVector<double>::operator[](this_01,iVar6 + -1);
      dVar12 = *pdVar3;
      pdVar3 = ImVector<double>::operator[](this_01,iVar6);
      *pdVar3 = dVar12 + *pdVar3;
    }
  }
  else {
    if (density) {
      pdVar3 = ImVector<double>::operator[](this_01,0);
      *pdVar3 = (double)iVar9 + *pdVar3;
    }
    for (iVar9 = 1; iVar9 < count; iVar9 = iVar9 + 1) {
      pdVar3 = ImVector<double>::operator[](this_01,iVar9 + -1);
      dVar12 = *pdVar3;
      pdVar3 = ImVector<double>::operator[](this_01,iVar9);
      *pdVar3 = dVar12 + *pdVar3;
    }
    if (density) {
      iVar10 = iVar6;
    }
    for (iVar6 = 0; iVar8 != iVar6; iVar6 = iVar6 + 1) {
      pdVar3 = ImVector<double>::operator[](this_01,iVar6);
      *pdVar3 = *pdVar3 * (1.0 / (double)iVar10);
    }
  }
  pdVar3 = ImVector<double>::operator[](this_01,i);
  local_c0 = *pdVar3;
LAB_001e3d52:
  PlotBars<double>((char *)this,(pIVar1->Temp1).Data,(pIVar1->Temp2).Data,count,local_b8 * bar_scale
                   ,0,8);
  return local_c0;
}

Assistant:

double PlotHistogram(const char* label_id, const T* values, int count, int bins, bool cumulative, bool density, ImPlotRange range, bool outliers, double bar_scale) {

    if (count <= 0 || bins == 0)
        return 0;

    if (range.Min == 0 && range.Max == 0) {
        T Min, Max;
        ImMinMaxArray(values, count, &Min, &Max);
        range.Min = (double)Min;
        range.Max = (double)Max;
    }

    double width;
    if (bins < 0)
        CalculateBins(values, count, bins, range, bins, width);
    else
        width = range.Size() / bins;

    ImVector<double>& bin_centers = GImPlot->Temp1;
    ImVector<double>& bin_counts  = GImPlot->Temp2;
    bin_centers.resize(bins);
    bin_counts.resize(bins);
    int below = 0;

    for (int b = 0; b < bins; ++b) {
        bin_centers[b] = range.Min + b * width + width * 0.5;
        bin_counts[b] = 0;
    }
    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        double val = (double)values[i];
        if (range.Contains(val)) {
            const int b = ImClamp((int)((val - range.Min) / width), 0, bins - 1);
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
        else if (val < range.Min) {
            below++;
        }
    }
    if (cumulative && density) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        double scale = 1.0 / (outliers ? count : counted);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count = bin_counts[bins-1];
    }
    else if (cumulative) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        max_count = bin_counts[bins-1];
    }
    else if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }
    PlotBars(label_id, &bin_centers.Data[0], &bin_counts.Data[0], bins, bar_scale*width);
    return max_count;
}